

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_base.c
# Opt level: O1

void apx_connectionBase_start(apx_connectionBase_t *self)

{
  apx_void_ptr_func_t *UNRECOVERED_JUMPTABLE;
  
  if (self != (apx_connectionBase_t *)0x0) {
    apx_fileManager_start(&self->file_manager);
    UNRECOVERED_JUMPTABLE = (self->vtable).start;
    if (UNRECOVERED_JUMPTABLE != (apx_void_ptr_func_t *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(self);
      return;
    }
  }
  return;
}

Assistant:

void apx_connectionBase_start(apx_connectionBase_t* self)
{
   if (self != NULL)
   {
#if APX_DEBUG_ENABLE
      if (self->mode == APX_SERVER_MODE)
      {
         printf("[BASE-CONNECTION %u] Starting connection\n", self->connection_id);
      }
      else
      {
         printf("[BASE-CONNECTION] Starting connection\n");
      }
#endif
#ifndef UNIT_TEST
      apx_fileManager_start(&self->file_manager);
      if (self->vtable.start != NULL)
      {
         self->vtable.start((void*)self);
      }
#endif
   }
}